

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

bool convertMetaObject(QMetaType fromType,void *from,QMetaType toType,void *to)

{
  undefined8 *puVar1;
  bool bVar2;
  QFlags<QMetaType::TypeFlag> lhs;
  QFlags<QMetaType::TypeFlag> rhs;
  QObject *pQVar3;
  QMetaObject *pQVar4;
  QMetaObject *pQVar5;
  undefined8 *in_RCX;
  long *in_RSI;
  long in_FS_OFFSET;
  QMetaObject *t;
  QMetaObject *f;
  QObject *fromObject;
  undefined4 in_stack_ffffffffffffff78;
  TypeFlag in_stack_ffffffffffffff7c;
  QMetaObject *in_stack_ffffffffffffff80;
  QMetaObject *in_stack_ffffffffffffff88;
  bool local_69;
  bool local_31;
  QFlagsStorageHelper<QMetaType::TypeFlag,_4> local_24;
  QFlagsStorageHelper<QMetaType::TypeFlag,_4> local_20;
  QFlagsStorageHelper<QMetaType::TypeFlag,_4> local_1c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.super_QFlagsStorage<QMetaType::TypeFlag>.i =
       (QFlagsStorage<QMetaType::TypeFlag>)QMetaType::flags((QMetaType *)in_stack_ffffffffffffff80);
  local_1c.super_QFlagsStorage<QMetaType::TypeFlag>.i =
       (QFlagsStorage<QMetaType::TypeFlag>)
       QFlags<QMetaType::TypeFlag>::operator&
                 ((QFlags<QMetaType::TypeFlag> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c
                 );
  bVar2 = QFlags::operator_cast_to_bool((QFlags *)&local_1c);
  local_69 = false;
  if (bVar2) {
    QMetaType::flags((QMetaType *)in_stack_ffffffffffffff80);
    local_24.super_QFlagsStorage<QMetaType::TypeFlag>.i =
         (QFlagsStorage<QMetaType::TypeFlag>)
         QFlags<QMetaType::TypeFlag>::operator&
                   ((QFlags<QMetaType::TypeFlag> *)in_stack_ffffffffffffff80,
                    in_stack_ffffffffffffff7c);
    local_69 = QFlags::operator_cast_to_bool((QFlags *)&local_24);
  }
  if (local_69 == false) {
    QMetaType::flags((QMetaType *)in_stack_ffffffffffffff80);
    lhs = QFlags<QMetaType::TypeFlag>::operator&
                    ((QFlags<QMetaType::TypeFlag> *)in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff7c);
    QMetaType::flags((QMetaType *)in_stack_ffffffffffffff80);
    rhs = QFlags<QMetaType::TypeFlag>::operator&
                    ((QFlags<QMetaType::TypeFlag> *)in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff7c);
    bVar2 = operator==(lhs,rhs);
    if (bVar2) {
      pQVar4 = QMetaType::metaObject((QMetaType *)in_stack_ffffffffffffff80);
      pQVar5 = QMetaType::metaObject((QMetaType *)in_stack_ffffffffffffff80);
      if (((pQVar4 != (QMetaObject *)0x0) && (pQVar5 != (QMetaObject *)0x0)) &&
         (bVar2 = QMetaObject::inherits(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80), bVar2)
         ) {
        QMetaType::destruct((QMetaType *)in_stack_ffffffffffffff80,
                            (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        QMetaType::construct
                  ((QMetaType *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                   (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        local_31 = true;
        goto LAB_0038a4b6;
      }
    }
  }
  else {
    puVar1 = (undefined8 *)*in_RSI;
    if (puVar1 != (undefined8 *)0x0) {
      in_stack_ffffffffffffff88 = (QMetaObject *)(**(code **)*puVar1)();
      QMetaType::metaObject((QMetaType *)in_stack_ffffffffffffff80);
      bVar2 = QMetaObject::inherits(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      if (bVar2) {
        QMetaType::metaObject((QMetaType *)in_stack_ffffffffffffff80);
        pQVar3 = QMetaObject::cast(in_stack_ffffffffffffff80,
                                   (QObject *)
                                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        *in_RCX = pQVar3;
        local_31 = true;
        goto LAB_0038a4b6;
      }
    }
    if ((puVar1 == (undefined8 *)0x0) &&
       (pQVar4 = QMetaType::metaObject((QMetaType *)in_stack_ffffffffffffff80),
       pQVar4 != (QMetaObject *)0x0)) {
      *in_RCX = 0;
      pQVar4 = QMetaType::metaObject((QMetaType *)in_stack_ffffffffffffff80);
      QMetaType::metaObject((QMetaType *)pQVar4);
      local_31 = QMetaObject::inherits(in_stack_ffffffffffffff88,pQVar4);
      goto LAB_0038a4b6;
    }
  }
  local_31 = false;
LAB_0038a4b6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_31;
}

Assistant:

static bool convertMetaObject(QMetaType fromType, const void *from, QMetaType toType, void *to)
{
    // handle QObject conversion
    if ((fromType.flags() & QMetaType::PointerToQObject) && (toType.flags() & QMetaType::PointerToQObject)) {
        QObject *fromObject = *static_cast<QObject * const *>(from);
        // use dynamic metatype of from if possible
        if (fromObject && fromObject->metaObject()->inherits(toType.metaObject()))  {
            *static_cast<QObject **>(to) = toType.metaObject()->cast(fromObject);
            return true;
        } else if (!fromObject && fromType.metaObject()) {
            // if fromObject is null, use static fromType to check if conversion works
            *static_cast<void **>(to) = nullptr;
            return fromType.metaObject()->inherits(toType.metaObject());
        }
    } else if ((fromType.flags() & QMetaType::IsPointer) == (toType.flags() & QMetaType::IsPointer)) {
        // fromType and toType are of same 'pointedness'
        const QMetaObject *f = fromType.metaObject();
        const QMetaObject *t = toType.metaObject();
        if (f && t && f->inherits(t)) {
            toType.destruct(to);
            toType.construct(to, from);
            return true;
        }
    }
    return false;
}